

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

int __thiscall CTcTokenizer::set_source(CTcTokenizer *this,char *src_filename,char *orig_name)

{
  int iVar1;
  undefined8 in_RAX;
  CTcSrcFile *pCVar2;
  size_t fname_len;
  size_t orig_fname_len;
  CTcTokFileDesc *pCVar3;
  CTcTokStream *pCVar4;
  int iVar5;
  int default_charset_error;
  int charset_error;
  undefined8 local_38;
  
  (this->linebuf_).buf_len_ = 0;
  if ((this->linebuf_).buf_size_ != 0) {
    *(this->linebuf_).buf_ = '\0';
  }
  (this->p_).p_ = (this->linebuf_).buf_;
  this->curbuf_ = &this->linebuf_;
  local_38 = in_RAX;
  pCVar2 = CTcSrcFile::open_source
                     (src_filename,this->res_loader_,this->default_charset_,
                      (int *)((long)&local_38 + 4),(int *)&local_38);
  if (pCVar2 == (CTcSrcFile *)0x0) {
    iVar5 = 0x2737;
    if ((int)local_38 != 0) {
      log_error(0x2748,this->default_charset_);
    }
  }
  else {
    fname_len = strlen(src_filename);
    orig_fname_len = strlen(orig_name);
    iVar5 = 0;
    pCVar3 = get_file_desc(this,src_filename,fname_len,0,orig_name,orig_fname_len);
    pCVar4 = (CTcTokStream *)operator_new(0x30);
    iVar1 = this->if_sp_;
    pCVar4->src_ = &pCVar2->super_CTcSrcObject;
    pCVar4->desc_ = pCVar3;
    pCVar4->parent_ = (CTcTokStream *)0x0;
    pCVar4->next_linenum_ = 1;
    pCVar4->field_0x28 = pCVar4->field_0x28 & 0xfc | local_38._4_1_ & 1;
    pCVar4->init_if_level_ = iVar1;
    this->str_ = pCVar4;
  }
  return iVar5;
}

Assistant:

int CTcTokenizer::set_source(const char *src_filename, const char *orig_name)
{
    CTcTokFileDesc *desc;
    CTcSrcFile *src;
    int charset_error;
    int default_charset_error;
    
    /* empty out the input line buffer */
    clear_linebuf();

    /* set up at the beginning of the input line buffer */
    start_new_line(&linebuf_, 0);

    /* create a reader for the source file */
    src = CTcSrcFile::open_source(src_filename, res_loader_,
                                  default_charset_, &charset_error,
                                  &default_charset_error);
    if (src == 0)
    {
        /* if we had a problem loading the default character set, log it */
        if (default_charset_error)
            log_error(TCERR_CANT_LOAD_DEFAULT_CHARSET, default_charset_);
        
        /* return failure */
        return TCERR_CANT_OPEN_SRC;
    }

    /* find or create a file descriptor for this filename */
    desc = get_file_desc(src_filename, strlen(src_filename), FALSE,
                         orig_name, strlen(orig_name));

    /* 
     *   Create a stream to read the source file.  The new stream has no
     *   parent, because this is the top-level source file, and was not
     *   included from any other file.  
     */
    str_ = new CTcTokStream(desc, src, 0, charset_error, if_sp_);

    /* success */
    return 0;
}